

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O0

void __thiscall MemoryBank::getChunk(MemoryBank *this,uintb offset,int4 size,uint1 *res)

{
  int iVar1;
  ulong uVar2;
  uint local_44;
  int4 skip;
  uintb offalign;
  uintb pagemask;
  int4 count;
  int4 cursize;
  uint1 *res_local;
  uintb uStack_18;
  int4 size_local;
  uintb offset_local;
  MemoryBank *this_local;
  
  iVar1 = this->pagesize;
  _count = res;
  uStack_18 = offset;
  for (pagemask._0_4_ = 0; (int)pagemask < size; pagemask._0_4_ = pagemask._4_4_ + (int)pagemask) {
    pagemask._4_4_ = this->pagesize;
    uVar2 = uStack_18 & ((long)(iVar1 + -1) ^ 0xffffffffffffffffU);
    local_44 = 0;
    if (uVar2 != uStack_18) {
      local_44 = (int)uStack_18 - (int)uVar2;
      pagemask._4_4_ = pagemask._4_4_ - local_44;
    }
    if (size - (int)pagemask < (int)pagemask._4_4_) {
      pagemask._4_4_ = size - (int)pagemask;
    }
    (*this->_vptr_MemoryBank[2])(this,uVar2,_count,(ulong)local_44,(ulong)pagemask._4_4_);
    uStack_18 = (long)(int)pagemask._4_4_ + uStack_18;
    _count = _count + (int)pagemask._4_4_;
  }
  return;
}

Assistant:

void MemoryBank::getChunk(uintb offset,int4 size,uint1 *res) const

{
  int4 cursize,count;
  uintb pagemask = (uintb) (pagesize-1);
  uintb offalign;
  int4 skip;

  count = 0;
  while(count < size) {
    cursize = pagesize;
    offalign = offset & ~pagemask;
    skip = 0;
    if (offalign != offset) {
      skip = offset-offalign;
      cursize -= skip;
    }
    if (size - count < cursize)
      cursize = size - count;
    getPage(offalign,res,skip,cursize);
    count += cursize;
    offset += cursize;
    res += cursize;
  }
}